

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RationalNum.cpp
# Opt level: O2

void __thiscall RationalNum::RationalNum(RationalNum *this,double x)

{
  long lVar1;
  ostream *poVar2;
  ulong denominator_;
  double dVar3;
  
  denominator_ = 1;
  while( true ) {
    lVar1 = (long)((double)(long)denominator_ * x);
    dVar3 = (double)(long)denominator_ * x - (double)lVar1;
    if ((dVar3 == 0.0) && (!NAN(dVar3))) break;
    if (0xccccccc < denominator_) {
      std::operator<<((ostream *)&std::cout,"this frational number : ");
      poVar2 = std::ostream::_M_insert<double>(x);
      poVar2 = std::operator<<(poVar2,
                               " can not be transfer to rational number, it\'s too long, now set it 0."
                              );
      std::endl<char,std::char_traits<char>>(poVar2);
      this->numerator = 0;
      this->denominator = 1;
      return;
    }
    denominator_ = denominator_ * 10;
  }
  this->numerator = lVar1;
  setDenominator(this,denominator_);
  simplify(this);
  return;
}

Assistant:

RationalNum::RationalNum(double x) {
    long long int i = 1;
    while (x * i - static_cast<long long int>(x * i) != 0) {
        if (i > INT_MAX / 10) {
            cout << "this frational number : " << x
                 << " can not be transfer to rational number, it's too long, now set it 0." << endl;
            setNumerator(0);
            setDenominator(1);
            return;
        } else {
            i *= 10;
        }
    }
    setNumerator(x * i);
    setDenominator(i);
    simplify();
}